

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  char *pcVar1;
  NameAndDesc *pNVar2;
  char *_testCase;
  IMutableRegistryHub *pIVar3;
  allocator local_1b9;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [55];
  allocator local_159;
  string local_158 [32];
  Catch local_138 [32];
  TestCase local_118;
  SourceLineInfo *local_30;
  SourceLineInfo *lineInfo_local;
  NameAndDesc *nameAndDesc_local;
  char *classOrQualifiedMethodName_local;
  ITestCase *testCase_local;
  AutoReg *this_local;
  
  local_30 = lineInfo;
  lineInfo_local = (SourceLineInfo *)nameAndDesc;
  nameAndDesc_local = (NameAndDesc *)classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = (char *)testCase;
  testCase_local = (ITestCase *)this;
  pIVar3 = getMutableRegistryHub();
  _testCase = classOrQualifiedMethodName_local;
  pNVar2 = nameAndDesc_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,(char *)pNVar2,&local_159);
  extractClassName(local_138,(string *)local_158);
  pcVar1 = *(char **)lineInfo_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,pcVar1,&local_191);
  pcVar1 = *(char **)&lineInfo_local->field_0x8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,pcVar1,&local_1b9);
  makeTestCase(&local_118,(ITestCase *)_testCase,(string *)local_138,(string *)local_190,
               (string *)local_1b8,local_30);
  (*pIVar3->_vptr_IMutableRegistryHub[3])(pIVar3,&local_118);
  TestCase::~TestCase(&local_118);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }